

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymTable.cpp
# Opt level: O2

void __thiscall SymTable::Print(SymTable *this)

{
  string *__lhs;
  bool bVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>
  item;
  
  __lhs = &item.second.Type;
  for (p_Var3 = (this->symtable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->symtable)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>
    ::pair(&item,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>
                  *)(p_Var3 + 1));
    bVar1 = std::operator==(__lhs,"int");
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&item.second);
      poVar2 = std::operator<<(poVar2,' ');
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2,' ');
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,item.second.iValue);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&item.second);
      poVar2 = std::operator<<(poVar2,' ');
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      std::operator<<(poVar2,' ');
      poVar2 = std::ostream::_M_insert<double>(item.second.dValue);
    }
    std::endl<char,std::char_traits<char>>(poVar2);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>
    ::~pair(&item);
  }
  return;
}

Assistant:

void SymTable::Print() {
    for(auto item : symtable){
        if(item.second.Type=="int")
            std::cout<<item.second.Name<<' '<<item.second.Type<<' '<<item.second.iValue<<std::endl;
        else
            std::cout<<item.second.Name<<' '<<item.second.Type<<' '<<item.second.dValue<<std::endl;
    }
}